

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O0

long coda_c_index_to_fortran_index(int num_dims,long *dim,long index)

{
  long lStack_88;
  long d [8];
  long local_40;
  long multiplier;
  long indexf;
  long i;
  long index_local;
  long *dim_local;
  long lStack_10;
  int num_dims_local;
  
  if (num_dims < 9) {
    i = index;
    for (indexf = (long)(num_dims + -1); -1 < indexf; indexf = indexf + -1) {
      d[indexf + -1] = i % dim[indexf];
      i = i / dim[indexf];
    }
    multiplier = 0;
    local_40 = 1;
    for (indexf = 0; indexf < num_dims; indexf = indexf + 1) {
      multiplier = local_40 * d[indexf + -1] + multiplier;
      local_40 = dim[indexf] * local_40;
    }
    lStack_10 = multiplier;
  }
  else {
    coda_set_error(-100,"num_dims argument (%d) exceeds limit (%d)",(ulong)(uint)num_dims,8);
    lStack_10 = -1;
  }
  return lStack_10;
}

Assistant:

LIBCODA_API long coda_c_index_to_fortran_index(int num_dims, const long dim[], long index)
{
    long i, indexf, multiplier, d[CODA_MAX_NUM_DIMS];

    if (num_dims > CODA_MAX_NUM_DIMS)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "num_dims argument (%d) exceeds limit (%d)", num_dims,
                       CODA_MAX_NUM_DIMS);
        return -1;
    }

    for (i = num_dims - 1; i >= 0; i--)
    {
        d[i] = index % dim[i];
        index /= dim[i];
    }

    indexf = 0;
    multiplier = 1;

    for (i = 0; i < num_dims; i++)
    {
        indexf += multiplier * d[i];
        multiplier *= dim[i];
    }

    return indexf;
}